

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

string * __thiscall Close::toString_abi_cxx11_(string *__return_storage_ptr__,Close *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,*(int *)&(this->super_BaseAction).field_0x2c);
  std::operator+(&bStack_58,"close ",&local_38);
  std::operator+(__return_storage_ptr__,&bStack_58," ");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  if ((this->super_BaseAction).status == ERROR) {
    std::__cxx11::string::string((string *)&local_38,(string *)&(this->super_BaseAction).errorMsg);
    std::operator+(&bStack_58,"Error:",&local_38);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Close::toString() const
{
    std::string msg("close " + std::to_string(tableId) + " ");
    if(getStatus() == ActionStatus::COMPLETED)
    {
        msg.append("Completed");
    }
    else  if(getStatus() == ActionStatus::ERROR)
    {
        msg.append("Error:" + getErrorMsg());
    }
    else msg.append("Pending");
    return msg;
}